

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v8::detail::
iterator_buffer<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v8::detail::buffer_traits>
::grow(iterator_buffer<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v8::detail::buffer_traits>
       *this,size_t capacity)

{
  char *buf_data;
  size_t capacity_local;
  iterator_buffer<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v8::detail::buffer_traits>
  *this_local;
  
  basic_memory_buffer<char,_250UL,_std::allocator<char>_>::resize(this->container_,capacity);
  buf_data = buffer<char>::operator[]<int>(&this->container_->super_buffer<char>,0);
  buffer<char>::set(&this->super_buffer<char>,buf_data,capacity);
  return;
}

Assistant:

void grow(size_t capacity) override {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }